

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataValueStore<duckdb::string_t>
               (string_t *source,data_ptr_t *row_location,idx_t offset_in_row,
               data_ptr_t *heap_location)

{
  uint uVar1;
  data_ptr_t pdVar2;
  char *pcVar3;
  ulong size;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 local_30;
  
  size = (ulong)(source->value).pointer.length;
  if (size < 0xd) {
    pdVar2 = *row_location;
    pcVar3 = (source->value).pointer.ptr;
    *(undefined8 *)(pdVar2 + offset_in_row) = *(undefined8 *)&source->value;
    *(char **)(pdVar2 + offset_in_row + 8) = pcVar3;
  }
  else {
    FastMemcpy(*heap_location,(source->value).pointer.ptr,size);
    pdVar2 = *heap_location;
    uVar1 = (source->value).pointer.length;
    if ((ulong)uVar1 < 0xd) {
      local_30 = 0;
      local_38 = 0;
      uStack_34 = 0;
      if (uVar1 != 0) {
        switchD_0193dc74::default(&local_38,pdVar2,(ulong)uVar1);
      }
    }
    else {
      local_38 = *(undefined4 *)pdVar2;
      uStack_34 = SUB84(pdVar2,0);
      local_30 = (undefined4)((ulong)pdVar2 >> 0x20);
    }
    pdVar2 = *row_location;
    *(uint *)(pdVar2 + offset_in_row) = uVar1;
    *(ulong *)(pdVar2 + offset_in_row + 4) = CONCAT44(uStack_34,local_38);
    *(undefined4 *)(pdVar2 + offset_in_row + 0xc) = local_30;
    *heap_location = *heap_location + (source->value).pointer.length;
  }
  return;
}

Assistant:

inline void TupleDataValueStore(const string_t &source, const data_ptr_t &row_location, const idx_t offset_in_row,
                                data_ptr_t &heap_location) {
#ifdef DEBUG
	source.VerifyCharacters();
#endif
	if (source.IsInlined()) {
		Store<string_t>(source, row_location + offset_in_row);
	} else {
		FastMemcpy(heap_location, source.GetData(), source.GetSize());
		Store<string_t>(string_t(const_char_ptr_cast(heap_location), UnsafeNumericCast<uint32_t>(source.GetSize())),
		                row_location + offset_in_row);
		heap_location += source.GetSize();
	}
}